

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visit(wasm::Expression*,wasm::IString_
          (void *this,Expression *curr,IString nextResult)

{
  char **ppcVar1;
  byte bVar2;
  _Rb_tree_color _Var3;
  iterator __position;
  pointer pSVar4;
  uint *puVar5;
  uintptr_t uVar6;
  _Base_ptr p_Var7;
  ValueBuilder *pVVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Name name;
  Name name_00;
  size_t sVar11;
  ValueBuilder *this_00;
  size_t sVar12;
  Module *pMVar13;
  size_t sVar14;
  int iVar15;
  Index IVar16;
  JsType JVar17;
  uint uVar18;
  Value *pVVar19;
  mapped_type *pmVar20;
  undefined8 extraout_RAX;
  double *pdVar21;
  long lVar22;
  size_type sVar23;
  Ref RVar24;
  Ref RVar25;
  Value *this_01;
  Ref RVar26;
  const_iterator cVar27;
  _Rb_tree_node_base *p_Var28;
  undefined1 (*pauVar29) [16];
  ArrayStorage *pAVar30;
  NameScope scope;
  pointer pSVar31;
  uint *puVar32;
  long lVar33;
  ulong extraout_RDX_01;
  _Base_ptr p_Var34;
  ulong extraout_RDX_02;
  char *extraout_RDX_03;
  undefined8 *puVar36;
  ValueBuilder *this_02;
  JsSign JVar37;
  void *pvVar38;
  Expression *pEVar40;
  Type TVar41;
  Module *pMVar42;
  Wasm2JSBuilder *this_03;
  wasm2js *pwVar43;
  undefined8 uVar44;
  wasm *this_04;
  Ref in_R8;
  Ref in_R9;
  _Base_ptr p_Var45;
  undefined8 uVar46;
  pointer ppEVar47;
  ulong uVar48;
  pointer ppEVar49;
  size_t sVar50;
  bool bVar51;
  IString specific;
  IString nextResult_00;
  IString nextResult_01;
  IString nextResult_02;
  IString nextResult_03;
  IString specific_00;
  IString nextResult_04;
  IString nextResult_05;
  IString nextResult_06;
  IString nextResult_07;
  IString nextResult_08;
  IString nextResult_09;
  IString nextResult_10;
  IString nextResult_11;
  IString nextResult_12;
  IString specific_01;
  IString nextResult_13;
  IString nextResult_14;
  IString nextResult_15;
  IString nextResult_16;
  IString nextResult_17;
  IString specific_02;
  IString nextResult_18;
  IString nextResult_19;
  IString specific_03;
  IString nextResult_20;
  IString nextResult_21;
  IString specific_04;
  IString nextResult_22;
  IString nextResult_23;
  IString nextResult_24;
  IString key;
  IString key_00;
  IString nextResult_25;
  IString nextResult_26;
  IString op;
  IString nextResult_27;
  IString specific_05;
  IString nextResult_28;
  IString nextResult_29;
  IString nextResult_30;
  IString specific_06;
  IString nextResult_31;
  IString nextResult_32;
  IString nextResult_33;
  IString key_01;
  IString nextResult_34;
  IString nextResult_35;
  IString op_00;
  IString op_01;
  IString key_02;
  IString nextResult_36;
  IString nextResult_37;
  IString nextResult_38;
  IString nextResult_39;
  IString nextResult_40;
  IString op_02;
  IString specific_07;
  IString specific_08;
  IString nextResult_41;
  IString nextResult_42;
  IString op_03;
  IString nextResult_43;
  IString nextResult_44;
  IString nextResult_45;
  IString specific_09;
  IString specific_10;
  IString nextResult_46;
  IString nextResult_47;
  IString nextResult_48;
  IString op_04;
  IString op_05;
  IString target;
  IString target_00;
  IString op_06;
  Name name_01;
  IString name_02;
  IString target_01;
  IString target_02;
  IString target_03;
  IString target_04;
  IString target_05;
  Name name_03;
  IString target_06;
  IString label;
  IString name_04;
  IString target_07;
  IString op_07;
  IString target_08;
  IString op_08;
  IString op_09;
  IString target_09;
  IString target_10;
  IString target_11;
  IString target_12;
  IString op_10;
  string_view sVar52;
  IString IVar53;
  Expression EVar54;
  undefined1 auVar55 [16];
  HeapAndPointer HVar56;
  Name name_05;
  Name NVar57;
  Ref args_3;
  IString old;
  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  targetIndexes;
  Name local_b8;
  undefined1 local_a8 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> emittedTargets;
  SwitchCase *local_70;
  ulong local_68;
  pointer local_60;
  SwitchCase *case_;
  char *pcStack_50;
  Ref local_48;
  undefined8 uStack_40;
  long *local_38;
  char *extraout_RDX;
  char *extraout_RDX_00;
  size_t sVar35;
  SwitchCase *pSVar39;
  
  IVar53.str._M_str = nextResult.str._M_str;
  specific_09.str._M_str = (char *)nextResult.str._M_len;
  args_3.inst = *(Value **)((long)this + 8);
  old.str._M_len = *(size_t *)((long)this + 0x10);
  *(char **)((long)this + 8) = specific_09.str._M_str;
  *(char **)((long)this + 0x10) = IVar53.str._M_str;
  sVar14 = _getGCData;
  pMVar13 = WASM_MEMORY_GROW;
  sVar12 = ABI::wasm2js::GET_STASHED_BITS;
  this_00 = cashew::B_NOT;
  sVar50 = _str;
  this_02 = cashew::L_NOT;
  sVar11 = __S_eq;
  pVVar8 = cashew::MINUS;
  sVar35 = ABI::wasm2js::TABLE_COPY;
  pMVar42 = MATH_CLZ32;
  if (curr == (Expression *)0x0) {
LAB_00142ce9:
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<ExpressionProcessor, cashew::Ref>::visit(Expression *) [SubType = ExpressionProcessor, ReturnType = cashew::Ref]"
                 );
  }
  case_ = (SwitchCase *)curr;
  local_38 = (long *)this;
  switch(curr->_id) {
  case BlockId:
    lVar22 = *(long *)((long)this + 0x188);
    if (lVar22 != 0) {
      lVar33 = (long)this + 0x180;
      do {
        bVar51 = *(Expression **)(lVar22 + 0x20) < curr;
        if (!bVar51) {
          lVar33 = lVar22;
        }
        lVar22 = *(long *)(lVar22 + 0x10 + (ulong)bVar51 * 8);
      } while (lVar22 != 0);
      if ((lVar33 != (long)this + 0x180) && (*(Expression **)(lVar33 + 0x20) <= curr)) {
        if (curr[2].type.id == 0) {
LAB_00142d08:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pEVar40 = (Expression *)**(undefined8 **)(curr + 2);
        IVar53.str._M_str = _finalize;
        specific_09.str._M_str = NO_RESULT;
        goto LAB_00141b3a;
      }
    }
    RVar24 = cashew::ValueBuilder::makeBlock();
    uVar6 = curr[2].type.id;
    if (uVar6 != 0) {
      uVar48 = 0;
      do {
        if (curr[2].type.id <= uVar48) goto LAB_00142d08;
        nextResult_14.str._M_str = _finalize;
        nextResult_14.str._M_len = (size_t)NO_RESULT;
        RVar25 = IString_(local_38,*(Expression **)(*(long *)(curr + 2) + uVar48 * 8),nextResult_14)
        ;
        flattenAppend(RVar24,RVar25);
        uVar48 = uVar48 + 1;
      } while (uVar6 != uVar48);
    }
    this = local_38;
    IVar53.str._M_str = (char *)curr[1].type.id;
    if (IVar53.str._M_str != (char *)0x0) {
      RVar25.inst = (Value *)0x3;
      name_01.super_IString.str._M_str = IVar53.str._M_str;
      name_01.super_IString.str._M_len = *(size_t *)(curr + 1);
      IVar53 = fromName((Wasm2JSBuilder *)*local_38,name_01,Label);
      name_02.str._M_str = (char *)RVar24.inst;
      name_02.str._M_len = (size_t)IVar53.str._M_str;
      RVar24 = cashew::ValueBuilder::makeLabel((ValueBuilder *)IVar53.str._M_len,name_02,RVar25);
    }
    break;
  case IfId:
    nextResult_15.str._M_str = (char *)cashew::RSHIFT;
    nextResult_15.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(this,*(Expression **)(curr + 1),nextResult_15);
    nextResult_16.str._M_str = _finalize;
    nextResult_16.str._M_len = (size_t)NO_RESULT;
    RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_16);
    if (*(Expression **)(curr + 2) == (Expression *)0x0) {
      RVar26.inst = (Value *)0x0;
    }
    else {
      nextResult_17.str._M_str = _finalize;
      nextResult_17.str._M_len = (size_t)NO_RESULT;
      RVar26 = IString_(this,*(Expression **)(curr + 2),nextResult_17);
    }
    RVar24 = cashew::ValueBuilder::makeIf(RVar24,RVar25,RVar26);
    this = this;
    break;
  case LoopId:
    old.str._M_str._0_4_ = *(int *)(curr + 1);
    old.str._M_str._4_4_ = *(undefined4 *)&curr[1].field_0x4;
    targetIndexes._M_t._M_impl._0_4_ = *(undefined4 *)&curr[1].type.id;
    targetIndexes._M_t._M_impl._4_4_ = *(undefined4 *)((long)&curr[1].type.id + 4);
    if (curr[1].type.id != 0) {
      local_a8 = (undefined1  [8])((long)this + 0x1d8);
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_a8,&old.str._M_str);
      RVar24.inst = *(Value **)(curr + 2);
      RVar25 = IString_(this,RVar24.inst,(IString)*(string_view *)((long)this + 8));
      if (*(long *)(*(long *)(curr + 2) + 8) == 0) {
        RVar25 = blockify(cashew::Ref_(RVar25.inst,RVar24);
        name.super_IString.str._M_len._4_4_ = old.str._M_str._4_4_;
        name.super_IString.str._M_len._0_4_ = (int)old.str._M_str;
        name.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
        name.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
        IVar53 = fromName(*this,name,Label);
        label.str._M_str = IVar53.str._M_str;
        label.str._M_len = (size_t)label.str._M_str;
        RVar24 = cashew::ValueBuilder::makeBreak((ValueBuilder *)IVar53.str._M_len,label);
        flattenAppend(RVar25,RVar24);
      }
      else if (*(long *)(*(long *)(curr + 2) + 8) != 1) {
        __assert_fail("curr->body->type == Type::none",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                      ,0x4ab,
                      "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitLoop(Loop *)"
                     );
      }
      pvVar38 = (void *)0x18;
      RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar24.inst)->type = Null;
      cashew::Value::free(RVar24.inst,pvVar38);
      (RVar24.inst)->type = Number;
      ((RVar24.inst)->field_1).str.str._M_len = 0x3ff0000000000000;
      RVar24 = cashew::ValueBuilder::makeWhile(RVar24,RVar25);
      name_00.super_IString.str._M_len._4_4_ = old.str._M_str._4_4_;
      name_00.super_IString.str._M_len._0_4_ = (int)old.str._M_str;
      name_00.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
      name_00.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
      RVar25.inst = (Value *)0x3;
      IVar53 = fromName(*this,name_00,Label);
      name_04.str._M_str = (char *)RVar24.inst;
      name_04.str._M_len = (size_t)IVar53.str._M_str;
      RVar24 = cashew::ValueBuilder::makeLabel((ValueBuilder *)IVar53.str._M_len,name_04,RVar25);
      this = this;
      break;
    }
    pEVar40 = *(Expression **)(curr + 2);
    goto LAB_00141b3a;
  case BreakId:
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = curr[2].type.id;
    if (emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
      RVar24 = makeBreakOrContinue(wasm::Name_(this,(Name)curr[1]);
      this = this;
      break;
    }
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(curr + 2);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&old.str._M_str;
    uVar6 = (curr->type).id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *(undefined8 *)(curr + 1);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)curr[1].type.id;
    old.str._M_str._0_4_ = (int)*(undefined8 *)curr;
    old.str._M_str._4_4_ = (undefined4)((ulong)*(undefined8 *)curr >> 0x20);
    targetIndexes._M_t._M_impl._0_4_ = SUB84(uVar6,0);
    targetIndexes._M_t._M_impl._4_4_ = SUB84(uVar6 >> 0x20,0);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pEVar40 = (Expression *)local_a8;
    local_a8[0] = IfId;
    emittedTargets._M_t._M_impl._0_8_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    goto LAB_00141b3a;
  case SwitchId:
    nextResult_09.str._M_str = (char *)cashew::RSHIFT;
    nextResult_09.str._M_len = EXPRESSION_RESULT;
    local_70 = (SwitchCase *)curr;
    RVar24 = IString_(this,(Expression *)curr[4].type.id,nextResult_09);
    RVar24.inst = (Value *)makeJsCoercion(RVar24,JS_INT);
    local_48 = cashew::ValueBuilder::makeSwitch(RVar24);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&targetIndexes
    ;
    targetIndexes._M_t._M_impl._0_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (curr[1].type.id != 0) {
      lVar22 = 0;
      ppEVar47 = (pointer)0x0;
      do {
        pmVar20 = std::
                  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&old.str._M_str,
                               (key_type *)
                               ((long)(((SwitchCase *)curr)->code).
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar22));
        local_a8._0_4_ = (uint)ppEVar47;
        __position._M_current =
             (pmVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pmVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (pmVar20,__position,(uint *)local_a8);
        }
        else {
          *__position._M_current = (uint)ppEVar47;
          (pmVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        ppEVar47 = (pointer)((long)ppEVar47 + 1);
        lVar22 = lVar22 + 0x10;
        curr = (Expression *)case_;
      } while (ppEVar47 <
               (case_->code).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    this = local_38;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
                 ::operator[]((map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
                               *)(local_38 + 0x35),(key_type *)&local_70);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&emittedTargets;
    emittedTargets._M_t._M_impl._0_8_ = (ulong)(uint)emittedTargets._M_t._M_impl._4_4_ << 0x20;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pSVar31 = (((mapped_type *)emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->
              super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (((mapped_type *)emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->
             super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (pSVar31 == pSVar4) {
      local_68 = 0;
    }
    else {
      local_68 = 0;
      do {
        local_b8.super_IString.str._M_len = (pSVar31->target).super_IString.str._M_len;
        local_b8.super_IString.str._M_str = (pSVar31->target).super_IString.str._M_str;
        local_60 = pSVar31;
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)local_a8,&local_b8);
        if ((pointer)local_b8.super_IString.str._M_str ==
            case_[1].code.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          cashew::ValueBuilder::appendDefaultToSwitch(local_48);
        }
        else {
          pmVar20 = std::
                    map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                  *)&old.str._M_str,&local_b8);
          puVar5 = (pmVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar32 = (pmVar20->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start; puVar32 != puVar5;
              puVar32 = puVar32 + 1) {
            uVar18 = *puVar32;
            pvVar38 = (void *)0x18;
            RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
            (RVar24.inst)->type = Null;
            cashew::Value::free(RVar24.inst,pvVar38);
            (RVar24.inst)->type = Number;
            ((RVar24.inst)->field_1).num = (double)uVar18;
            cashew::ValueBuilder::appendCaseToSwitch(local_48,RVar24);
          }
        }
        this = local_38;
        ppEVar47 = (local_60->code).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar49 = (local_60->code).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (ppEVar47 != ppEVar49) {
          do {
            pVVar19 = (Value *)*ppEVar47;
            nextResult_10.str._M_str = _finalize;
            nextResult_10.str._M_len = (size_t)NO_RESULT;
            RVar24.inst = pVVar19;
            RVar25 = IString_(this,(Expression *)pVVar19,nextResult_10);
            RVar24 = blockify(cashew::Ref_(RVar25.inst,RVar24);
            cashew::ValueBuilder::appendCodeToSwitch(local_48,RVar24,false);
            ppEVar47 = ppEVar47 + 1;
          } while (ppEVar47 != ppEVar49);
          local_68 = CONCAT71((int7)((ulong)extraout_RAX >> 8),
                              (pVVar19->field_1).str.str._M_len == 1);
        }
        pSVar31 = local_60 + 1;
      } while (pSVar31 != pSVar4);
    }
    pSVar31 = (pointer)0x0;
    p_Var28 = targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pSVar39 = case_;
    if (targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)&targetIndexes) {
      do {
        case_ = (SwitchCase *)(p_Var28 + 1);
        cVar27 = std::
                 _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)local_a8,(key_type *)case_);
        if (cVar27._M_node == (_Base_ptr)&emittedTargets) {
          if ((((ulong)pSVar31 & 1) == 0) &&
             (*(long *)emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              *(long *)(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) &&
              (local_68 & 1) == 0)) {
            RVar25.inst = (Value *)0x0;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = extraout_RDX_01;
            RVar24 = cashew::ValueBuilder::makeBreak((ValueBuilder *)0x0,(IString)(auVar9 << 0x40));
            RVar24 = blockify(cashew::Ref_(RVar24.inst,RVar25);
            pSVar31 = (pointer)CONCAT71((int7)((ulong)pSVar31 >> 8),1);
            cashew::ValueBuilder::appendCodeToSwitch(local_48,RVar24,false);
          }
          p_Var34 = p_Var28[1]._M_parent;
          if (p_Var34 !=
              (_Base_ptr)
              local_70[1].code.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            p_Var45 = p_Var28[1]._M_left;
            p_Var7 = p_Var28[1]._M_right;
            local_60 = pSVar31;
            if (p_Var45 != p_Var7) {
              do {
                _Var3 = p_Var45->_M_color;
                pvVar38 = (void *)0x18;
                RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
                (RVar24.inst)->type = Null;
                cashew::Value::free(RVar24.inst,pvVar38);
                (RVar24.inst)->type = Number;
                ((RVar24.inst)->field_1).num = (double)_Var3;
                cashew::ValueBuilder::appendCaseToSwitch(local_48,RVar24);
                p_Var45 = (_Base_ptr)&p_Var45->field_0x4;
              } while (p_Var45 != p_Var7);
              p_Var34 = p_Var28[1]._M_parent;
            }
            this = local_38;
            RVar24.inst = (Value *)(case_->target).super_IString.str._M_len;
            name_03.super_IString.str._M_str = (char *)p_Var34;
            name_03.super_IString.str._M_len = (size_t)RVar24.inst;
            RVar25 = makeBreakOrContinue(wasm::Name_(local_38,name_03);
            pSVar31 = local_60;
            RVar24 = blockify(cashew::Ref_(RVar25.inst,RVar24);
            cashew::ValueBuilder::appendCodeToSwitch(local_48,RVar24,false);
          }
        }
        p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28);
        pSVar39 = local_70;
      } while (p_Var28 != (_Rb_tree_node_base *)&targetIndexes);
    }
    cVar27 = std::
             _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)local_a8,(key_type *)&pSVar39[1].target.super_IString.str._M_str);
    RVar24.inst = local_48.inst;
    if (cVar27._M_node == (_Base_ptr)&emittedTargets) {
      if ((((ulong)pSVar31 & 1) == 0) &&
         (*(long *)emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          *(long *)(emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 8) &&
          (local_68 & 1) == 0)) {
        RVar26.inst = (Value *)0x0;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = extraout_RDX_02;
        RVar25 = cashew::ValueBuilder::makeBreak((ValueBuilder *)0x0,(IString)(auVar10 << 0x40));
        RVar25 = blockify(cashew::Ref_(RVar25.inst,RVar26);
        cashew::ValueBuilder::appendCodeToSwitch(RVar24,RVar25,false);
      }
      cashew::ValueBuilder::appendDefaultToSwitch(RVar24);
      ppcVar1 = &pSVar39[1].target.super_IString.str._M_str;
      RVar25.inst = (Value *)*ppcVar1;
      RVar26 = makeBreakOrContinue(wasm::Name_(this,(IString)*(IString *)ppcVar1);
      RVar25 = blockify(cashew::Ref_(RVar26.inst,RVar25);
      cashew::ValueBuilder::appendCodeToSwitch(RVar24,RVar25,false);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_a8);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)&old.str._M_str);
    break;
  case CallId:
    if (curr[4]._id == BlockId) {
      ppcVar1 = &old.str._M_str;
      Fatal::Fatal((Fatal *)ppcVar1);
      Fatal::operator<<((Fatal *)ppcVar1,(char (*) [40])"tail calls not yet supported in wasm2js");
      goto LAB_00142f86;
    }
    IVar53 = fromName(*this,(Name)curr[3],Top);
    target_01.str._M_str = (uintptr_t)IVar53.str._M_str;
    target_01.str._M_len = target_01.str._M_str;
    RVar24 = cashew::ValueBuilder::makeCall((ValueBuilder *)IVar53.str._M_len,target_01);
    old.str._M_str._0_4_ = (int)RVar24.inst;
    old.str._M_str._4_4_ = (undefined4)((ulong)RVar24.inst >> 0x20);
    local_48.inst._0_1_ = 1;
    if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
      target_01.str._M_str = *(uintptr_t *)(curr + 3);
      NVar57.super_IString.str._M_str = (char *)target_01.str._M_str;
      NVar57.super_IString.str._M_len = *(size_t *)((long)this + 0x20);
      lVar22 = ::wasm::Module::getFunction(NVar57);
      local_48.inst._0_1_ = *(long *)(lVar22 + 0x20) != 0;
    }
    ppEVar47 = (pointer)curr[1].type.id;
    if (ppEVar47 != (pointer)0x0) {
      ppEVar49 = (pointer)0x0;
      do {
        if ((((SwitchCase *)curr)->code).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish <= ppEVar49) goto LAB_00142d08;
        pEVar40 = (((SwitchCase *)curr)->code).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[(long)ppEVar49];
        nextResult_32.str._M_str = (char *)cashew::RSHIFT;
        nextResult_32.str._M_len = EXPRESSION_RESULT;
        TVar41.id = (uintptr_t)pEVar40;
        target_01.str._M_str = (uintptr_t)IString_(local_38,pEVar40,nextResult_32);
        if ((char)local_48.inst != '\0') {
          JVar17 = ::wasm::wasmToJsType((wasm *)(pEVar40->type).id,TVar41);
          target_01.str._M_str = makeJsCoercion((Ref)target_01.str._M_str,JVar17);
        }
        puVar36 = (undefined8 *)cashew::Ref::operator[]((int)&old + 8);
        cashew::Value::push_back((Value *)*puVar36,(Ref)target_01.str._M_str);
        ppEVar49 = (pointer)((long)ppEVar49 + 1);
        curr = (Expression *)case_;
      } while (ppEVar47 != ppEVar49);
      RVar24.inst = (Value *)CONCAT44(old.str._M_str._4_4_,(int)old.str._M_str);
      this = local_38;
    }
    if ((char)local_48.inst == '\0') break;
    this_04 = (wasm *)((Type *)&(((SwitchCase *)curr)->target).super_IString.str._M_str)->id;
    goto LAB_001423de;
  case CallIndirectId:
    RVar24 = visitCallIndirect(wasm::CallIndirect__(this,(CallIndirect *)curr);
    this = this;
    break;
  case LocalGetId:
    sVar52 = (string_view)
             ::wasm::Function::getLocalNameOrGeneric((uint)*(undefined8 *)((long)this + 0x18));
    this_03 = *this;
    scope = Local;
    goto LAB_001411ec;
  case LocalSetId:
    pEVar40 = (Expression *)curr[1].type.id;
    EVar54 = (Expression)
             ::wasm::Function::getLocalNameOrGeneric((uint)*(undefined8 *)((long)this + 0x18));
    IVar53.str._M_str = (char *)0x2;
    goto LAB_0014163c;
  case GlobalGetId:
  case RefFuncId:
    this_03 = *this;
    sVar52 = *(string_view *)(curr + 1);
    scope = Top;
LAB_001411ec:
    sVar52 = (string_view)fromName(this_03,(Name)sVar52,scope);
    pvVar38 = (void *)0x18;
    RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar24.inst)->type = Null;
    cashew::Value::free(RVar24.inst,pvVar38);
    (RVar24.inst)->type = String;
    ((RVar24.inst)->field_1).str.str = sVar52;
    this = local_38;
    break;
  case GlobalSetId:
    pEVar40 = *(Expression **)(curr + 2);
    EVar54 = curr[1];
    IVar53.str._M_str = (char *)0x1;
LAB_0014163c:
    this = local_38;
    name_05.super_IString.str._M_len = EVar54.type.id;
    name_05.super_IString.str._M_str = IVar53.str._M_str;
    RVar24 = makeSetVar(wasm::Expression*,wasm::Expression*,wasm::Name,wasm::NameScope_
                       (local_38,pEVar40,EVar54._0_8_,name_05,(NameScope)in_R9.inst);
    break;
  case LoadId:
    if ((*(char **)(curr + 2) != (char *)0x0) &&
       (IVar53.str._M_str = (char *)(ulong)curr[1]._id, *(char **)(curr + 2) != IVar53.str._M_str))
    {
      __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                    ,0x593,
                    "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitLoad(Load *)"
                   );
    }
    RVar24 = makePointer(wasm::Expression*,wasm::Address_
                       (this,*(Expression **)(curr + 3),(Address)curr[1].type.id);
    uVar48 = (curr->type).id;
    if (6 < uVar48) {
LAB_00142d27:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    iVar15 = (int)uVar48;
    if (iVar15 == 5) {
      local_48.inst = (Value *)cashew::HEAPF64;
      uStack_40 = _VTT;
      pvVar38 = (void *)0x18;
      RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar25.inst)->type = Null;
      cashew::Value::free(RVar25.inst,pvVar38);
      (RVar25.inst)->type = String;
      ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
      ((RVar25.inst)->field_1).str.str._M_str = uStack_40;
      iVar15 = 3;
    }
    else {
      if (iVar15 == 4) {
        pdVar21 = (double *)&cashew::HEAPF32;
      }
      else {
        if (iVar15 != 2) {
          Fatal::Fatal((Fatal *)&old.str._M_str);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                     "Unhandled type in load: ",0x18);
          Fatal::operator<<((Fatal *)&old.str._M_str,&curr->type);
          goto LAB_00142f86;
        }
        bVar2 = *(byte *)&(case_->code).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        IVar53.str._M_str = (char *)(ulong)bVar2;
        if (bVar2 != 4) {
          old.str._M_str._4_4_ = (undefined4)(uVar48 >> 0x20);
          old.str._M_str._0_4_ = iVar15;
          if (bVar2 == 2) {
            if (((uVar48 < 6) &&
                (IVar53.str._M_str = (char *)0x32, (0x32UL >> (uVar48 & 0x3f) & 1) != 0)) ||
               ((uVar18 = ::wasm::Type::getByteSize(), uVar18 < 3 ||
                (*(char *)((long)&(case_->code).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1) == '\0')))) {
              pdVar21 = (double *)&cashew::HEAPU16;
            }
            else {
              pdVar21 = (double *)&cashew::HEAP16;
            }
            local_48.inst = (Value *)*pdVar21;
            uStack_40 = (char *)pdVar21[1];
            pvVar38 = (void *)0x18;
            RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
            (RVar25.inst)->type = Null;
            cashew::Value::free(RVar25.inst,pvVar38);
            (RVar25.inst)->type = String;
            ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
            ((RVar25.inst)->field_1).str.str._M_str = uStack_40;
            iVar15 = 1;
          }
          else {
            if (bVar2 != 1) {
              Fatal::Fatal((Fatal *)&old.str._M_str);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                         "Unhandled number of bytes in i32 load: ",0x27);
              Fatal::operator<<((Fatal *)&old.str._M_str,(uchar *)&case_->code);
              goto LAB_00142f86;
            }
            if ((((uVar48 < 6) &&
                 (IVar53.str._M_str = (char *)0x32, (0x32UL >> (uVar48 & 0x3f) & 1) != 0)) ||
                (uVar18 = ::wasm::Type::getByteSize(), uVar18 < 2)) ||
               (*(char *)((long)&(case_->code).
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1) == '\0')) {
              pdVar21 = (double *)&cashew::HEAPU8;
            }
            else {
              pdVar21 = (double *)&cashew::HEAP8;
            }
            local_48.inst = (Value *)*pdVar21;
            uStack_40 = (char *)pdVar21[1];
            pvVar38 = (void *)0x18;
            RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
            (RVar25.inst)->type = Null;
            cashew::Value::free(RVar25.inst,pvVar38);
            (RVar25.inst)->type = String;
            ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
            ((RVar25.inst)->field_1).str.str._M_str = uStack_40;
            iVar15 = 0;
          }
          goto LAB_001422ff;
        }
        pdVar21 = (double *)&cashew::HEAP32;
      }
      local_48.inst = (Value *)*pdVar21;
      uStack_40 = (char *)pdVar21[1];
      pvVar38 = (void *)0x18;
      RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar25.inst)->type = Null;
      cashew::Value::free(RVar25.inst,pvVar38);
      (RVar25.inst)->type = String;
      ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
      ((RVar25.inst)->field_1).str.str._M_str = uStack_40;
      iVar15 = 2;
    }
LAB_001422ff:
    target_01.str._M_str = (uintptr_t)cashew::ValueBuilder::makePtrShift(RVar24,iVar15);
    RVar24 = cashew::ValueBuilder::makeSub(RVar25,(Ref)target_01.str._M_str);
    old.str._M_str._0_4_ = (int)RVar24.inst;
    old.str._M_str._4_4_ = (undefined4)((ulong)RVar24.inst >> 0x20);
    if ((char)case_[1].target.super_IString.str._M_len == '\x01') {
      local_48.inst = (Value *)cashew::ATOMICS;
      uStack_40 = _makeJsCoercedZero;
      pvVar38 = (void *)0x18;
      pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar19->type = Null;
      cashew::Value::free(pVVar19,pvVar38);
      pVVar19->type = String;
      (pVVar19->field_1).str.str._M_len = (size_t)local_48.inst;
      (pVVar19->field_1).str.str._M_str = uStack_40;
      key_02.str._M_str = IVar53.str._M_str;
      key_02.str._M_len = std::cerr;
      RVar24 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar19,cashew::LOAD,key_02);
      RVar24 = cashew::ValueBuilder::makeCall(RVar24);
      uVar18 = (int)&old + 8;
      puVar36 = (undefined8 *)cashew::Ref::operator[](uVar18);
      cashew::ValueBuilder::appendToCall(RVar24,(Value *)*puVar36);
      puVar36 = (undefined8 *)cashew::Ref::operator[](uVar18);
      target_01.str._M_str = *puVar36;
      cashew::ValueBuilder::appendToCall(RVar24,(Ref)target_01.str._M_str);
      old.str._M_str._0_4_ = (int)RVar24.inst;
      old.str._M_str._4_4_ = (undefined4)((ulong)RVar24.inst >> 0x20);
    }
    this = local_38;
    if ((*(int *)(*local_38 + 100) != 0) && ((*(byte *)(local_38 + 5) & 1) == 0)) break;
    this_04 = (wasm *)(curr->type).id;
LAB_001423de:
    JVar17 = ::wasm::wasmToJsType(this_04,target_01.str._M_str);
    goto LAB_001423e8;
  case StoreId:
    RVar24 = visitStore(wasm::Store__(this,(Store *)curr);
    this = this;
    break;
  case ConstId:
    RVar24 = visitConst(wasm::Const__(curr,(Const *)&switchD_00140946::switchdataD_0017c0a8);
    this = this;
    break;
  case UnaryId:
    uVar48 = (curr->type).id;
    if (6 < uVar48) goto LAB_00142d27;
    iVar15 = (int)uVar48;
    if (1 < iVar15 - 4U) {
      if (iVar15 != 2) {
        Fatal::Fatal((Fatal *)&old.str._M_str);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                   "Unhandled type in unary: ",0x19);
        Fatal::operator<<((Fatal *)&old.str._M_str,(Unary *)case_);
        goto LAB_00142f86;
      }
      iVar15 = *(int *)(curr + 1);
      if (iVar15 < 0x14) {
        if (iVar15 != 0) {
          if ((iVar15 == 2) || (iVar15 == 4)) {
            ::wasm::handle_unreachable
                      ("i32 unary should have been removed",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                       ,0x65c);
          }
          goto switchD_0014210a_caseD_31;
        }
        nextResult_33.str._M_str = (char *)cashew::RSHIFT;
        nextResult_33.str._M_len = EXPRESSION_RESULT;
        RVar24.inst = cashew::RSHIFT;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_33);
        goto LAB_00141eb7;
      }
      RVar24.inst = cashew::RSHIFT;
      if (iVar15 - 0x14U < 0xe) {
        specific_09.str._M_str =
             (char *)((long)&switchD_00142421::switchdataD_0017c444 +
                     (long)(int)(&switchD_00142421::switchdataD_0017c444)[iVar15 - 0x14U]);
        switch(iVar15) {
        case 0x14:
          nextResult_47.str._M_str = (char *)cashew::RSHIFT;
          nextResult_47.str._M_len = EXPRESSION_RESULT;
          RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_47);
          break;
        default:
          goto switchD_0014210a_caseD_31;
        case 0x19:
        case 0x1d:
          goto switchD_0014210a_caseD_34;
        case 0x1b:
        case 0x1f:
          goto switchD_0014210a_caseD_35;
        case 0x21:
          specific_09.str._M_len = std::cout;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_F32,specific_09);
          specific_10.str._M_str = specific_09.str._M_str;
          specific_10.str._M_len = _containsPass;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_I32,specific_10);
          sVar35 = std::cout;
          pMVar42 = ABI::wasm2js::SCRATCH_STORE_F32;
          nextResult_46.str._M_str = (char *)cashew::RSHIFT;
          nextResult_46.str._M_len = EXPRESSION_RESULT;
          RVar24.inst = cashew::RSHIFT;
          RVar25 = IString_(local_38,(Expression *)curr[1].type.id,nextResult_46);
          target_11.str._M_str = (char *)RVar25.inst;
          target_11.str._M_len = sVar35;
          RVar25 = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)pMVar42,target_11,RVar24);
          sVar35 = _containsPass;
          pMVar42 = ABI::wasm2js::SCRATCH_LOAD_I32;
          pvVar38 = (void *)0x18;
          pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
          pVVar19->type = Null;
          cashew::Value::free(pVVar19,pvVar38);
          pVVar19->type = Number;
          (pVVar19->field_1).str.str._M_len = 0x4000000000000000;
          target_12.str._M_str = (char *)pVVar19;
          target_12.str._M_len = sVar35;
          RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)pMVar42,target_12,RVar24);
          goto LAB_00142919;
        }
LAB_00142957:
        this = local_38;
        op_10.str._M_str = (char *)RVar25.inst;
        op_10.str._M_len = sVar50;
        RVar24 = cashew::ValueBuilder::makeUnary(this_02,op_10,RVar24);
        break;
      }
      switch(iVar15) {
      case 0x2f:
        nextResult_35.str._M_str = (char *)cashew::RSHIFT;
        nextResult_35.str._M_len = EXPRESSION_RESULT;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_35);
        sVar35 = ___cxa_begin_catch;
        RVar24.inst = cashew::LSHIFT.inst;
        pvVar38 = (void *)0x18;
        pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar19->type = Null;
        cashew::Value::free(pVVar19,pvVar38);
        pVVar19->type = Number;
        (pVVar19->field_1).arr = (ArrayStorage *)0x4038000000000000;
        op_00.str._M_str = (char *)pVVar19;
        op_00.str._M_len = sVar35;
        RVar24 = cashew::ValueBuilder::makeBinary(RVar25.inst,RVar24,op_00,in_R8);
        uVar44 = _operator_delete;
        pVVar19 = cashew::RSHIFT;
        pvVar38 = (void *)0x18;
        RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar25.inst)->type = Null;
        cashew::Value::free(RVar25.inst,pvVar38);
        (RVar25.inst)->type = Number;
        pAVar30 = (ArrayStorage *)0x4038000000000000;
        break;
      case 0x30:
        nextResult_48.str._M_str = (char *)cashew::RSHIFT;
        nextResult_48.str._M_len = EXPRESSION_RESULT;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_48);
        sVar35 = ___cxa_begin_catch;
        RVar24.inst = cashew::LSHIFT.inst;
        pvVar38 = (void *)0x18;
        pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar19->type = Null;
        cashew::Value::free(pVVar19,pvVar38);
        pVVar19->type = Number;
        (pVVar19->field_1).arr = (ArrayStorage *)0x4030000000000000;
        op_04.str._M_str = (char *)pVVar19;
        op_04.str._M_len = sVar35;
        RVar24 = cashew::ValueBuilder::makeBinary(RVar25.inst,RVar24,op_04,in_R8);
        uVar44 = _operator_delete;
        pVVar19 = cashew::RSHIFT;
        pvVar38 = (void *)0x18;
        RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar25.inst)->type = Null;
        cashew::Value::free(RVar25.inst,pvVar38);
        (RVar25.inst)->type = Number;
        pAVar30 = (ArrayStorage *)0x4030000000000000;
        break;
      default:
switchD_0014210a_caseD_31:
        ::wasm::handle_unreachable
                  ("unhandled unary",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                   ,0x69c);
      case 0x34:
      case 0x36:
switchD_0014210a_caseD_34:
        nextResult_36.str._M_str = (char *)cashew::RSHIFT;
        nextResult_36.str._M_len = EXPRESSION_RESULT;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_36);
        op_07.str._M_str = (char *)RVar25.inst;
        op_07.str._M_len = sVar12;
        RVar25 = cashew::ValueBuilder::makeUnary(this_00,op_07,RVar24);
        this_02 = this_00;
        sVar50 = sVar12;
        goto LAB_00142957;
      case 0x35:
      case 0x37:
switchD_0014210a_caseD_35:
        nextResult_38.str._M_str = (char *)cashew::RSHIFT;
        nextResult_38.str._M_len = EXPRESSION_RESULT;
        RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_38);
        op_08.str._M_str = (char *)RVar25.inst;
        op_08.str._M_len = sVar12;
        RVar25 = cashew::ValueBuilder::makeUnary(this_00,op_08,RVar24);
        op_09.str._M_str = (char *)RVar25.inst;
        op_09.str._M_len = sVar12;
        RVar24 = cashew::ValueBuilder::makeUnary(this_00,op_09,RVar24);
        auVar55._8_8_ = CEIL;
        auVar55._0_8_ = cashew::TRSHIFT.inst;
        pvVar38 = (void *)0x18;
        RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar25.inst)->type = Null;
        cashew::Value::free(RVar25.inst,pvVar38);
        (RVar25.inst)->type = Number;
        ((RVar25.inst)->field_1).str.str._M_len = 0;
        this = local_38;
        goto LAB_00141a06;
      }
      auVar55._8_8_ = uVar44;
      auVar55._0_8_ = pVVar19;
      ((RVar25.inst)->field_1).arr = pAVar30;
      this = local_38;
      goto LAB_00141a06;
    }
    switch(*(undefined4 *)(curr + 1)) {
    case 6:
    case 7:
      nextResult_13.str._M_str = (char *)cashew::RSHIFT;
      nextResult_13.str._M_len = EXPRESSION_RESULT;
      RVar24.inst = cashew::RSHIFT;
      RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_13);
      op_06.str._M_str = (char *)RVar25.inst;
      op_06.str._M_len = sVar11;
      RVar24 = cashew::ValueBuilder::makeUnary(pVVar8,op_06,RVar24);
      goto LAB_001424bb;
    case 8:
    case 9:
      puVar36 = &MATH_ABS;
      break;
    case 10:
    case 0xb:
      puVar36 = &MATH_CEIL;
      break;
    case 0xc:
    case 0xd:
      puVar36 = &MATH_FLOOR;
      break;
    case 0xe:
    case 0xf:
      puVar36 = &MATH_TRUNC;
      break;
    case 0x10:
    case 0x11:
      ::wasm::handle_unreachable
                ("operation should have been removed in previous passes",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x6f2);
    case 0x12:
    case 0x13:
      puVar36 = &MATH_SQRT;
      break;
    default:
      ::wasm::handle_unreachable
                ("unhandled unary float operator",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x6f5);
    case 0x23:
      nextResult_45.str._M_str = (char *)cashew::RSHIFT;
      nextResult_45.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_45);
      RVar24.inst = (Value *)makeJsCoercion(RVar24,JS_INT);
      goto LAB_001427ba;
    case 0x24:
      nextResult_43.str._M_str = (char *)cashew::RSHIFT;
      nextResult_43.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_43);
      RVar24.inst = (Value *)makeJsCoercion(RVar24,JS_INT);
      goto LAB_00142768;
    case 0x25:
      nextResult_40.str._M_str = (char *)cashew::RSHIFT;
      nextResult_40.str._M_len = EXPRESSION_RESULT;
      RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_40);
      sVar35 = CEIL;
      RVar24.inst = cashew::TRSHIFT.inst;
      pvVar38 = (void *)0x18;
      pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar19->type = Null;
      cashew::Value::free(pVVar19,pvVar38);
      this = local_38;
      pVVar19->type = Number;
      (pVVar19->field_1).str.str._M_len = 0;
      op_02.str._M_str = (char *)pVVar19;
      op_02.str._M_len = sVar35;
      RVar24 = cashew::ValueBuilder::makeBinary(RVar25.inst,RVar24,op_02,in_R8);
      goto LAB_001427ba;
    case 0x26:
      nextResult_42.str._M_str = (char *)cashew::RSHIFT;
      nextResult_42.str._M_len = EXPRESSION_RESULT;
      RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_42);
      sVar35 = CEIL;
      RVar24.inst = cashew::TRSHIFT.inst;
      pvVar38 = (void *)0x18;
      pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar19->type = Null;
      cashew::Value::free(pVVar19,pvVar38);
      this = local_38;
      pVVar19->type = Number;
      (pVVar19->field_1).str.str._M_len = 0;
      op_03.str._M_str = (char *)pVVar19;
      op_03.str._M_len = sVar35;
      RVar24 = cashew::ValueBuilder::makeBinary(RVar25.inst,RVar24,op_03,in_R8);
      goto LAB_00142768;
    case 0x2b:
      nextResult_39.str._M_str = (char *)cashew::RSHIFT;
      nextResult_39.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_39);
LAB_00142768:
      JVar17 = JS_DOUBLE;
      goto LAB_001423e8;
    case 0x2c:
      nextResult_44.str._M_str = (char *)cashew::RSHIFT;
      nextResult_44.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_44);
LAB_001427ba:
      JVar17 = JS_FLOAT;
      goto LAB_001423e8;
    case 0x2d:
      specific_07.str._M_str = (char *)&switchD_00141195::switchdataD_0017c3a4;
      specific_07.str._M_len = ABI::wasm2js::SCRATCH_LOAD_F64;
      puVar32 = &switchD_00141195::switchdataD_0017c3a4;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_I32,specific_07);
      specific_08.str._M_str = (char *)puVar32;
      specific_08.str._M_len = __Unwind_Resume;
      ABI::wasm2js::ensureHelpers((wasm2js *)local_38[4],ABI::wasm2js::SCRATCH_LOAD_F32,specific_08)
      ;
      sVar35 = ABI::wasm2js::SCRATCH_LOAD_F64;
      pMVar42 = ABI::wasm2js::SCRATCH_STORE_I32;
      pvVar38 = (void *)0x18;
      pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar19->type = Null;
      cashew::Value::free(pVVar19,pvVar38);
      pVVar19->type = Number;
      (pVVar19->field_1).str.str._M_len = 0x4000000000000000;
      nextResult_41.str._M_str = (char *)cashew::RSHIFT;
      nextResult_41.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(local_38,(Expression *)curr[1].type.id,nextResult_41);
      target_09.str._M_str = (char *)pVVar19;
      target_09.str._M_len = sVar35;
      RVar25 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                         ((ValueBuilder *)pMVar42,target_09,RVar24,in_R8);
      target_10.str._M_str = extraout_RDX_03;
      target_10.str._M_len = __Unwind_Resume;
      RVar24 = cashew::ValueBuilder::makeCall
                         ((ValueBuilder *)ABI::wasm2js::SCRATCH_LOAD_F32,target_10);
LAB_00142919:
      this = local_38;
      RVar24 = cashew::ValueBuilder::makeSeq(RVar25,RVar24);
      goto LAB_001423f0;
    }
    pVVar8 = (ValueBuilder *)*puVar36;
    sVar35 = puVar36[1];
    nextResult_37.str._M_str = (char *)cashew::RSHIFT;
    nextResult_37.str._M_len = EXPRESSION_RESULT;
    RVar24.inst = cashew::RSHIFT;
    RVar25 = IString_(this,(Expression *)curr[1].type.id,nextResult_37);
    target_08.str._M_str = (char *)RVar25.inst;
    target_08.str._M_len = sVar35;
    RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar8,target_08,RVar24);
LAB_001424bb:
    this = local_38;
    if ((curr->type).id == 4) {
      RVar24.inst = (Value *)makeJsCoercion(RVar24,JS_FLOAT);
      this = local_38;
    }
    break;
  case BinaryId:
    nextResult_07.str._M_str = (char *)cashew::RSHIFT;
    nextResult_07.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_07);
    this = local_38;
    nextResult_08.str._M_str = (char *)cashew::RSHIFT;
    nextResult_08.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,*(Expression **)(curr + 2),nextResult_08);
    uVar48 = (curr->type).id;
    if (6 < uVar48) goto LAB_00142d27;
    if ((int)uVar48 - 4U < 2) {
      switch(*(undefined4 *)
              &(case_->code).
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start) {
      case 0x32:
      case 0x3f:
        puVar36 = &cashew::PLUS;
        break;
      case 0x33:
      case 0x40:
        puVar36 = &cashew::MINUS;
        break;
      case 0x34:
      case 0x41:
        puVar36 = &cashew::MUL;
        break;
      case 0x35:
      case 0x42:
        puVar36 = &cashew::DIV;
        break;
      default:
        ppcVar1 = &old.str._M_str;
        Fatal::Fatal((Fatal *)ppcVar1);
        Fatal::operator<<((Fatal *)ppcVar1,(char (*) [34])"Unhandled binary float operator: ");
        goto LAB_00142f86;
      case 0x37:
      case 0x44:
        puVar36 = &MATH_MIN;
        goto LAB_00142217;
      case 0x38:
      case 0x45:
        puVar36 = &MATH_MAX;
LAB_00142217:
        target_07.str._M_str = (char *)RVar24.inst;
        target_07.str._M_len = puVar36[1];
        RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                           ((ValueBuilder *)*puVar36,target_07,RVar25,in_R8);
        goto LAB_00142229;
      }
      op_01.str._M_str = (char *)RVar25.inst;
      op_01.str._M_len = puVar36[1];
      RVar24 = cashew::ValueBuilder::makeBinary(RVar24.inst,(Value *)*puVar36,op_01,in_R8);
LAB_00142229:
      if ((case_->target).super_IString.str._M_str != (char *)0x4) break;
      goto LAB_001427ba;
    }
    if ((int)uVar48 != 2) {
      Fatal::Fatal((Fatal *)&old.str._M_str);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                 "Unhandled type in binary: ",0x1a);
      Fatal::operator<<((Fatal *)&old.str._M_str,(Binary *)case_);
LAB_00142f86:
      Fatal::~Fatal((Fatal *)&old.str._M_str);
    }
    switch(*(undefined4 *)
            &(case_->code).
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start) {
    case 0:
      puVar36 = &cashew::PLUS;
      break;
    case 1:
      puVar36 = &cashew::MINUS;
      break;
    case 2:
      sVar35 = cashew::CONDITIONAL;
      pMVar42 = MATH_IMUL;
      if (uVar48 == 2) goto LAB_001409e4;
      pauVar29 = (undefined1 (*) [16])&cashew::MUL;
      goto LAB_00142ccf;
    case 3:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_SIGNED);
      puVar36 = &cashew::DIV;
      goto LAB_00142bf6;
    case 4:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_UNSIGNED);
      puVar36 = &cashew::DIV;
      goto LAB_00142b99;
    case 5:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_SIGNED);
      puVar36 = &cashew::MOD;
LAB_00142bf6:
      target_01.str._M_str = *puVar36;
      sVar35 = puVar36[1];
      JVar37 = JS_SIGNED;
LAB_00142c05:
      RVar25.inst = (Value *)makeSigning(RVar25,JVar37);
      this = local_38;
      goto LAB_00142c30;
    case 6:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_UNSIGNED);
      puVar36 = &cashew::MOD;
LAB_00142b99:
      target_01.str._M_str = *puVar36;
      sVar35 = puVar36[1];
      JVar37 = JS_UNSIGNED;
      goto LAB_00142c05;
    case 7:
      puVar36 = &cashew::AND;
      break;
    case 8:
      puVar36 = &cashew::OR;
      break;
    case 9:
      puVar36 = &cashew::XOR;
      break;
    case 10:
      puVar36 = &cashew::LSHIFT.inst;
      break;
    case 0xb:
      puVar36 = &cashew::RSHIFT;
      break;
    case 0xc:
      puVar36 = &cashew::TRSHIFT.inst;
      break;
    case 0xd:
    case 0xe:
      ::wasm::handle_unreachable
                ("should be removed already",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x77c);
    case 0xf:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_SIGNED);
      puVar36 = &cashew::EQ;
      goto LAB_00142ca5;
    case 0x10:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_SIGNED);
      puVar36 = &cashew::NE;
      goto LAB_00142ca5;
    case 0x11:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_SIGNED);
      puVar36 = &cashew::LT;
      goto LAB_00142ca5;
    case 0x12:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_UNSIGNED);
      puVar36 = &cashew::LT;
      goto LAB_00142c7d;
    case 0x13:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_SIGNED);
      puVar36 = &cashew::LE;
      goto LAB_00142ca5;
    case 0x14:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_UNSIGNED);
      puVar36 = &cashew::LE;
      goto LAB_00142c7d;
    case 0x15:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_SIGNED);
      puVar36 = &cashew::GT;
      goto LAB_00142ca5;
    case 0x16:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_UNSIGNED);
      puVar36 = &cashew::GT;
      goto LAB_00142c7d;
    case 0x17:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_SIGNED);
      puVar36 = &cashew::GE;
LAB_00142ca5:
      uVar44 = *puVar36;
      uVar46 = puVar36[1];
      JVar37 = JS_SIGNED;
LAB_00142cb4:
      auVar55._8_8_ = uVar46;
      auVar55._0_8_ = uVar44;
      RVar25.inst = (Value *)makeSigning(RVar25,JVar37);
      this = local_38;
      goto LAB_00141a06;
    case 0x18:
      RVar24.inst = (Value *)makeSigning(RVar24,JS_UNSIGNED);
      puVar36 = &cashew::GE;
LAB_00142c7d:
      uVar44 = *puVar36;
      uVar46 = puVar36[1];
      JVar37 = JS_UNSIGNED;
      goto LAB_00142cb4;
    default:
      ::wasm::handle_unreachable
                ("unhandled i32 binary operator",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x77e);
    case 0x39:
    case 0x46:
      pauVar29 = (undefined1 (*) [16])&cashew::EQ;
      goto LAB_00142ccf;
    case 0x3a:
    case 0x47:
      pauVar29 = (undefined1 (*) [16])&cashew::NE;
      goto LAB_00142ccf;
    case 0x3b:
    case 0x48:
      pauVar29 = (undefined1 (*) [16])&cashew::LT;
      goto LAB_00142ccf;
    case 0x3c:
    case 0x49:
      pauVar29 = (undefined1 (*) [16])&cashew::LE;
      goto LAB_00142ccf;
    case 0x3d:
    case 0x4a:
      pauVar29 = (undefined1 (*) [16])&cashew::GT;
      goto LAB_00142ccf;
    case 0x3e:
    case 0x4b:
      pauVar29 = (undefined1 (*) [16])&cashew::GE;
LAB_00142ccf:
      auVar55 = *pauVar29;
LAB_00141a06:
      op.str._M_len = auVar55._8_8_;
      op.str._M_str = (char *)RVar25.inst;
      RVar24 = cashew::ValueBuilder::makeBinary(RVar24.inst,auVar55._0_8_,op,in_R8);
      goto LAB_001423f0;
    }
    target_01.str._M_str = *puVar36;
    sVar35 = puVar36[1];
LAB_00142c30:
    op_05.str._M_str = (char *)RVar25.inst;
    op_05.str._M_len = sVar35;
    RVar24 = cashew::ValueBuilder::makeBinary(RVar24.inst,(Ref)target_01.str._M_str,op_05,in_R8);
    JVar17 = ::wasm::wasmToJsType
                       ((wasm *)(case_->target).super_IString.str._M_str,target_01.str._M_str);
LAB_001423e8:
    RVar24.inst = (Value *)makeJsCoercion(RVar24,JVar17);
    this = (long *)this;
    break;
  case SelectId:
    RVar24 = visitSelect(wasm::Select__(this,(Select *)curr);
    this = this;
    break;
  case DropId:
    pEVar40 = *(Expression **)(curr + 1);
    IVar53.str._M_str = _finalize;
    specific_09.str._M_str = NO_RESULT;
LAB_00141b3a:
    nextResult_31.str._M_str = IVar53.str._M_str;
    nextResult_31.str._M_len = (size_t)specific_09.str._M_str;
    RVar24 = IString_(this,pEVar40,nextResult_31);
    this = this;
    break;
  case ReturnId:
    target_01.str._M_str = *(uintptr_t *)(curr + 1);
    if ((Expression *)target_01.str._M_str == (Expression *)0x0) {
      RVar24.inst = (Value *)0x0;
    }
    else {
      nextResult_21.str._M_str = (char *)cashew::RSHIFT;
      nextResult_21.str._M_len = EXPRESSION_RESULT;
      RVar24 = IString_(this,(Expression *)target_01.str._M_str,nextResult_21);
      if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
        target_01.str._M_str = *(undefined8 *)((long)this + 0x18);
        sVar23 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)(*this + 0x380),(key_type *)target_01.str._M_str);
        if (sVar23 == 0) goto LAB_00141b76;
      }
      JVar17 = ::wasm::wasmToJsType(*(wasm **)(*(long *)(curr + 1) + 8),target_01.str._M_str);
      RVar24.inst = (Value *)makeJsCoercion(RVar24,JVar17);
    }
LAB_00141b76:
    RVar24 = cashew::ValueBuilder::makeReturn(RVar24);
    this = this;
    break;
  case MemorySizeId:
    pSVar39 = FUNCTION_TABLE;
    pMVar42 = WASM_MEMORY_SIZE;
    goto LAB_00141502;
  case MemoryGrowId:
    pwVar43 = *(wasm2js **)((long)this + 0x20);
    if ((*(long **)(pwVar43 + 0x78) == *(long **)(pwVar43 + 0x80)) ||
       (lVar22 = **(long **)(pwVar43 + 0x78), IVar53.str._M_str = *(char **)(lVar22 + 0x40),
       IVar53.str._M_str <= *(char **)(lVar22 + 0x38))) {
      specific_06.str._M_str = IVar53.str._M_str;
      specific_06.str._M_len = (size_t)__M_create;
      ABI::wasm2js::ensureHelpers(pwVar43,ABI::wasm2js::TRAP,specific_06);
      target_05.str._M_str = extraout_RDX_00;
      target_05.str._M_len = (size_t)__M_create;
      RVar24 = cashew::ValueBuilder::makeCall((ValueBuilder *)ABI::wasm2js::TRAP,target_05);
      this = local_38;
      break;
    }
    target_01.str._M_str = *(uintptr_t *)(curr + 1);
    nextResult_20.str._M_str = (char *)cashew::RSHIFT;
    nextResult_20.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(this,(Expression *)target_01.str._M_str,nextResult_20);
    JVar17 = ::wasm::wasmToJsType(*(wasm **)(*(long *)(curr + 1) + 8),target_01.str._M_str);
    RVar25.inst = (Value *)makeJsCoercion(RVar24,JVar17);
    RVar24.inst = (Value *)curr;
    sVar35 = sVar14;
    pMVar42 = pMVar13;
    goto LAB_00141eb7;
  case NopId:
  case AtomicFenceId:
    RVar24 = cashew::ValueBuilder::makeToplevel();
    this = this;
    break;
  case UnreachableId:
    specific_01.str._M_str = IVar53.str._M_str;
    specific_01.str._M_len = (size_t)__M_create;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TRAP,specific_01);
    specific_09.str._M_str = extraout_RDX;
    pSVar39 = __M_create;
    pMVar42 = ABI::wasm2js::TRAP;
LAB_00141502:
    this = local_38;
    target_02.str._M_str = specific_09.str._M_str;
    target_02.str._M_len = (size_t)pSVar39;
    RVar24 = cashew::ValueBuilder::makeCall((ValueBuilder *)pMVar42,target_02);
    break;
  case AtomicRMWId:
    HVar56 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)(byte)curr[1].field_0x4,*(Expression **)(curr + 2),
                        (Index)curr[1].type.id);
    puVar32 = &switchD_00140f50::switchdataD_0017c4a0;
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
      IVar53.str._M_str = "add";
      break;
    case 1:
      IVar53.str._M_str = "sub";
      break;
    case 2:
      IVar53.str._M_str = "and";
      break;
    case 3:
      IVar53.str._M_str = "or";
      uVar44 = 2;
      goto LAB_00142020;
    case 4:
      IVar53.str._M_str = "xor";
      break;
    case 5:
      IVar53.str._M_str = "exchange";
      uVar44 = 8;
      goto LAB_00142020;
    default:
      ::wasm::handle_unreachable
                ("unimp",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x82f);
    }
    uVar44 = 3;
LAB_00142020:
    auVar55 = ::wasm::IString::interned(uVar44,IVar53.str._M_str,0);
    key_01.str._M_len = auVar55._8_8_;
    local_48.inst = (Value *)cashew::ATOMICS;
    uStack_40 = _makeJsCoercedZero;
    pvVar38 = (void *)0x18;
    pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar19->type = Null;
    cashew::Value::free(pVVar19,pvVar38);
    pVVar19->type = String;
    (pVVar19->field_1).str.str._M_len = (size_t)local_48.inst;
    (pVVar19->field_1).str.str._M_str = uStack_40;
    key_01.str._M_str = (char *)puVar32;
    RVar24 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar19,auVar55._0_8_,key_01);
    RVar24 = cashew::ValueBuilder::makeCall(RVar24);
    cashew::ValueBuilder::appendToCall(RVar24,HVar56.heap.inst);
    cashew::ValueBuilder::appendToCall(RVar24,HVar56.ptr.inst);
    this = local_38;
    nextResult_34.str._M_str = (char *)cashew::RSHIFT;
    nextResult_34.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)case_[1].target.super_IString.str._M_len,nextResult_34)
    ;
LAB_001420c3:
    cashew::ValueBuilder::appendToCall(RVar24,RVar25);
    break;
  case AtomicCmpxchgId:
    HVar56 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)curr[1]._id,*(Expression **)(curr + 2),(Index)curr[1].type.id);
    local_48 = HVar56.ptr.inst;
    nextResult_23.str._M_str = (char *)cashew::RSHIFT;
    nextResult_23.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[2].type.id,nextResult_23);
    nextResult_24.str._M_str = (char *)cashew::RSHIFT;
    nextResult_24.str._M_len = EXPRESSION_RESULT;
    pVVar19 = cashew::RSHIFT;
    target_01.str._M_str = (uintptr_t)IString_(local_38,*(Expression **)(curr + 3),nextResult_24);
    case_ = cashew::ATOMICS;
    pcStack_50 = _makeJsCoercedZero;
    pvVar38 = (void *)0x18;
    this_01 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    this_01->type = Null;
    cashew::Value::free(this_01,pvVar38);
    this_01->type = String;
    (this_01->field_1).arr = (ArrayStorage *)case_;
    (this_01->field_1).str.str._M_str = pcStack_50;
    key.str._M_str = (char *)pVVar19;
    key.str._M_len = _isIdentPart;
    RVar24 = cashew::ValueBuilder::makeDot((ValueBuilder *)this_01,cashew::COMPARE_EXCHANGE,key);
    RVar24 = cashew::ValueBuilder::makeCall(RVar24);
    cashew::ValueBuilder::appendToCall(RVar24,HVar56.heap.inst);
    cashew::ValueBuilder::appendToCall(RVar24,local_48);
    cashew::ValueBuilder::appendToCall(RVar24,RVar25);
    cashew::ValueBuilder::appendToCall(RVar24,(Ref)target_01.str._M_str);
    JVar17 = ::wasm::wasmToJsType((wasm *)(curr->type).id,target_01.str._M_str);
    this = local_38;
    goto LAB_001423e8;
  case AtomicWaitId:
  case SIMDExtractId:
  case SIMDReplaceId:
  case SIMDShuffleId:
  case SIMDTernaryId:
  case SIMDShiftId:
  case SIMDLoadId:
  case SIMDLoadStoreLaneId:
  case PopId:
  case TableInitId:
  case TryId:
  case TryTableId:
  case ThrowId:
  case RethrowId:
  case ThrowRefId:
  case TupleMakeId:
  case TupleExtractId:
  case RefI31Id:
  case I31GetId:
  case CallRefId:
  case RefTestId:
  case RefCastId:
  case BrOnId:
  case StructNewId:
  case StructGetId:
  case StructSetId:
  case StructRMWId:
  case StructCmpxchgId:
  case ArrayNewId:
  case ArrayNewDataId:
  case ArrayNewElemId:
  case ArrayNewFixedId:
  case ArrayGetId:
  case ArraySetId:
  case ArrayLenId:
  case ArrayCopyId:
  case ArrayFillId:
  case ArrayInitDataId:
  case ArrayInitElemId:
  case StringNewId:
  case StringConstId:
  case StringMeasureId:
  case StringEncodeId:
  case StringConcatId:
  case StringEqId:
  case StringWTF16GetId:
  case StringSliceWTFId:
  case ContNewId:
  case ContBindId:
  case SuspendId:
  case ResumeId:
  case ResumeThrowId:
  case StackSwitchId:
    unimplemented(wasm::Expression__(curr,(Expression *)&switchD_00140946::switchdataD_0017c0a8);
    goto LAB_00142ce9;
  case AtomicNotifyId:
    local_48.inst = (Value *)cashew::ATOMICS;
    uStack_40 = _makeJsCoercedZero;
    pvVar38 = (void *)0x18;
    pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar19->type = Null;
    cashew::Value::free(pVVar19,pvVar38);
    pVVar19->type = String;
    *(undefined4 *)&pVVar19->field_1 = local_48.inst._0_4_;
    *(undefined4 *)((long)&pVVar19->field_1 + 4) = local_48.inst._4_4_;
    *(undefined4 *)((long)&pVVar19->field_1 + 8) = (undefined4)uStack_40;
    *(undefined4 *)((long)&pVVar19->field_1 + 0xc) = uStack_40._4_4_;
    auVar55 = ::wasm::IString::interned(6,"notify",0);
    key_00.str._M_len = auVar55._8_8_;
    key_00.str._M_str = IVar53.str._M_str;
    RVar24 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar19,auVar55._0_8_,key_00);
    RVar24 = cashew::ValueBuilder::makeCall(RVar24);
    local_48.inst = (Value *)cashew::HEAP32;
    uStack_40 = cashew::HEAP16;
    pvVar38 = (void *)0x18;
    RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar25.inst)->type = Null;
    cashew::Value::free(RVar25.inst,pvVar38);
    this = local_38;
    (RVar25.inst)->type = String;
    ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
    ((RVar25.inst)->field_1).str.str._M_str = uStack_40;
    cashew::ValueBuilder::appendToCall(RVar24,RVar25);
    RVar25 = makePointer(wasm::Expression*,wasm::Address_
                       (this,(Expression *)curr[1].type.id,(Address)*(address64_t *)(curr + 1));
    RVar25 = cashew::ValueBuilder::makePtrShift(RVar25,2);
    cashew::ValueBuilder::appendToCall(RVar24,RVar25);
    nextResult_25.str._M_str = (char *)cashew::RSHIFT;
    nextResult_25.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(this,*(Expression **)(curr + 2),nextResult_25);
    RVar25.inst = (Value *)makeSigning(RVar25,JS_UNSIGNED);
    goto LAB_001420c3;
  case MemoryInitId:
    specific_00.str._M_str = IVar53.str._M_str;
    specific_00.str._M_len = (size_t)_finalize;
    ABI::wasm2js::ensureHelpers
              (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::MEMORY_INIT,specific_00);
    local_48.inst = (Value *)ABI::wasm2js::MEMORY_INIT;
    case_ = _finalize;
    IVar16 = getDataIndex((Wasm2JSBuilder *)*local_38,(Name)curr[1]);
    local_60 = (pointer)(double)IVar16;
    pvVar38 = (void *)0x18;
    pVVar19 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar19->type = Null;
    cashew::Value::free(pVVar19,pvVar38);
    pVVar19->type = Number;
    (pVVar19->field_1).num = (double)local_60;
    nextResult_04.str._M_str = (char *)cashew::RSHIFT;
    nextResult_04.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(local_38,*(Expression **)(curr + 2),nextResult_04);
    nextResult_05.str._M_str = (char *)cashew::RSHIFT;
    nextResult_05.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[2].type.id,nextResult_05);
    nextResult_06.str._M_str = (char *)cashew::RSHIFT;
    nextResult_06.str._M_len = EXPRESSION_RESULT;
    RVar26 = IString_(local_38,*(Expression **)(curr + 3),nextResult_06);
    this = local_38;
    target_00.str._M_str = (char *)pVVar19;
    target_00.str._M_len = (size_t)case_;
    RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref,cashew::Ref>
                       (local_48.inst,target_00,RVar24,RVar25,RVar26,args_3);
    break;
  case DataDropId:
    specific_03.str._M_str = IVar53.str._M_str;
    specific_03.str._M_len = _dump;
    ABI::wasm2js::ensureHelpers
              (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::DATA_DROP,specific_03);
    sVar35 = _dump;
    pMVar42 = ABI::wasm2js::DATA_DROP;
    IVar16 = getDataIndex((Wasm2JSBuilder *)*local_38,(Name)curr[1]);
    local_48.inst = (Value *)(double)IVar16;
    pvVar38 = (void *)0x18;
    RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar25.inst)->type = Null;
    cashew::Value::free(RVar25.inst,pvVar38);
    (RVar25.inst)->type = Number;
    ((RVar25.inst)->field_1).num = (double)local_48.inst;
    RVar24.inst = (Value *)curr;
    this = local_38;
LAB_00141eb7:
    target_06.str._M_str = (char *)RVar25.inst;
    target_06.str._M_len = sVar35;
    RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref>((ValueBuilder *)pMVar42,target_06,RVar24);
    break;
  case MemoryCopyId:
    pwVar43 = *(wasm2js **)((long)this + 0x20);
    puVar36 = &ABI::wasm2js::MEMORY_COPY;
    goto LAB_00141a90;
  case MemoryFillId:
    pwVar43 = *(wasm2js **)((long)this + 0x20);
    puVar36 = &ABI::wasm2js::MEMORY_FILL;
    goto LAB_00141a90;
  case RefNullId:
    local_48.inst = (Value *)NULL_;
    uStack_40 = UINT32ARRAY;
    pvVar38 = (void *)0x18;
    RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar24.inst)->type = Null;
    cashew::Value::free(RVar24.inst,pvVar38);
    (RVar24.inst)->type = String;
    ((RVar24.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
    ((RVar24.inst)->field_1).str.str._M_str = uStack_40;
    this = this;
    break;
  case RefIsNullId:
    nextResult_26.str._M_str = (char *)cashew::RSHIFT;
    nextResult_26.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(this,*(Expression **)(curr + 1),nextResult_26);
    auVar55._8_8_ = cashew::BREAK;
    auVar55._0_8_ = cashew::EQ;
    local_48.inst = (Value *)NULL_;
    uStack_40 = UINT32ARRAY;
    pvVar38 = (void *)0x18;
    RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar25.inst)->type = Null;
    cashew::Value::free(RVar25.inst,pvVar38);
    (RVar25.inst)->type = String;
    ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
    ((RVar25.inst)->field_1).str.str._M_str = uStack_40;
    this = local_38;
    goto LAB_00141a06;
  case RefEqId:
    nextResult_02.str._M_str = (char *)cashew::RSHIFT;
    nextResult_02.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(this,*(Expression **)(curr + 1),nextResult_02);
    auVar55._8_8_ = cashew::BREAK;
    auVar55._0_8_ = cashew::EQ;
    nextResult_03.str._M_str = (char *)cashew::RSHIFT;
    nextResult_03.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[1].type.id,nextResult_03);
    this = local_38;
    goto LAB_00141a06;
  case TableGetId:
    local_48.inst = (Value *)FUNCTION_TABLE;
    uStack_40 = _isalnum;
    pvVar38 = (void *)0x18;
    RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar24.inst)->type = Null;
    cashew::Value::free(RVar24.inst,pvVar38);
    (RVar24.inst)->type = String;
    ((RVar24.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
    ((RVar24.inst)->field_1).str.str._M_str = uStack_40;
    nextResult_27.str._M_str = (char *)cashew::RSHIFT;
    nextResult_27.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,*(Expression **)(curr + 2),nextResult_27);
    this = local_38;
    RVar24 = cashew::ValueBuilder::makeSub(RVar24,RVar25);
    break;
  case TableSetId:
    local_48.inst = (Value *)FUNCTION_TABLE;
    uStack_40 = _isalnum;
    pvVar38 = (void *)0x18;
    RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar24.inst)->type = Null;
    cashew::Value::free(RVar24.inst,pvVar38);
    (RVar24.inst)->type = String;
    ((RVar24.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
    ((RVar24.inst)->field_1).str.str._M_str = uStack_40;
    nextResult_11.str._M_str = (char *)cashew::RSHIFT;
    nextResult_11.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,*(Expression **)(curr + 2),nextResult_11);
    RVar24 = cashew::ValueBuilder::makeSub(RVar24,RVar25);
    nextResult_12.str._M_str = (char *)cashew::RSHIFT;
    nextResult_12.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[2].type.id,nextResult_12);
    auVar55._8_8_ = BLOCK;
    auVar55._0_8_ = cashew::SET;
    this = local_38;
    goto LAB_00141a06;
  case TableSizeId:
    local_48.inst = (Value *)FUNCTION_TABLE;
    uStack_40 = _isalnum;
    pvVar38 = (void *)0x18;
    RVar24.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar24.inst)->type = Null;
    cashew::Value::free(RVar24.inst,pvVar38);
    (RVar24.inst)->type = String;
    ((RVar24.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
    ((RVar24.inst)->field_1).str.str._M_str = uStack_40;
    local_48.inst = (Value *)LENGTH;
    uStack_40 = cashew::WHILE;
    pvVar38 = (void *)0x18;
    RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar25.inst)->type = Null;
    cashew::Value::free(RVar25.inst,pvVar38);
    this = local_38;
    (RVar25.inst)->type = String;
    ((RVar25.inst)->field_1).str.str._M_len = (size_t)local_48.inst;
    ((RVar25.inst)->field_1).str.str._M_str = uStack_40;
    RVar24 = cashew::ValueBuilder::makeDot(RVar24,RVar25);
    break;
  case TableGrowId:
    IVar53.str._M_len = _getStruct;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TABLE_GROW,IVar53);
    specific.str._M_str = IVar53.str._M_str;
    specific.str._M_len = cashew::CALL;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TABLE_FILL,specific);
    sVar35 = _getStruct;
    pMVar42 = ABI::wasm2js::TABLE_GROW;
    nextResult_00.str._M_str = (char *)cashew::RSHIFT;
    nextResult_00.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(local_38,*(Expression **)(curr + 2),nextResult_00);
    nextResult_01.str._M_str = (char *)cashew::RSHIFT;
    nextResult_01.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[2].type.id,nextResult_01);
    this = local_38;
LAB_001409e4:
    target.str._M_str = (char *)RVar24.inst;
    target.str._M_len = sVar35;
    RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                       ((ValueBuilder *)pMVar42,target,RVar25,in_R8);
    break;
  case TableFillId:
    specific_02.str._M_str = IVar53.str._M_str;
    specific_02.str._M_len = cashew::CALL;
    ABI::wasm2js::ensureHelpers
              (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TABLE_FILL,specific_02);
    pMVar42 = ABI::wasm2js::TABLE_FILL;
    local_48.inst = (Value *)cashew::CALL;
    nextResult_18.str._M_str = (char *)cashew::RSHIFT;
    nextResult_18.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(local_38,*(Expression **)(curr + 2),nextResult_18);
    nextResult_19.str._M_str = (char *)cashew::RSHIFT;
    nextResult_19.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[2].type.id,nextResult_19);
    pEVar40 = *(Expression **)(curr + 3);
    goto LAB_00141ae3;
  case TableCopyId:
    pwVar43 = *(wasm2js **)((long)this + 0x20);
    puVar36 = &ABI::wasm2js::TABLE_COPY;
LAB_00141a90:
    specific_05.str._M_str = IVar53.str._M_str;
    specific_05.str._M_len = puVar36[1];
    ABI::wasm2js::ensureHelpers(pwVar43,(Module *)*puVar36,specific_05);
    pMVar42 = (Module *)*puVar36;
    local_48.inst = (Value *)puVar36[1];
    nextResult_28.str._M_str = (char *)cashew::RSHIFT;
    nextResult_28.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(local_38,*(Expression **)(curr + 1),nextResult_28);
    nextResult_29.str._M_str = (char *)cashew::RSHIFT;
    nextResult_29.str._M_len = EXPRESSION_RESULT;
    RVar25 = IString_(local_38,(Expression *)curr[1].type.id,nextResult_29);
    pEVar40 = *(Expression **)(curr + 2);
LAB_00141ae3:
    nextResult_30.str._M_str = (char *)cashew::RSHIFT;
    nextResult_30.str._M_len = EXPRESSION_RESULT;
    RVar26 = IString_(local_38,pEVar40,nextResult_30);
    this = local_38;
    target_04.str._M_str = (char *)RVar24.inst;
    target_04.str._M_len = (size_t)local_48.inst;
    RVar24 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref>
                       ((ValueBuilder *)pMVar42,target_04,RVar25,RVar26,in_R9);
    break;
  case RefAsId:
    if (*(int *)(curr + 1) != 0) {
      __assert_fail("curr->op == RefAsNonNull",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                    ,0x969,
                    "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitRefAs(RefAs *)"
                   );
    }
    specific_04.str._M_str = IVar53.str._M_str;
    specific_04.str._M_len = (size_t)__M_create;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::TRAP,specific_04);
    nextResult_22.str._M_str = (char *)cashew::RSHIFT;
    nextResult_22.str._M_len = EXPRESSION_RESULT;
    RVar24 = IString_(this,(Expression *)curr[1].type.id,nextResult_22);
    auVar55 = ::wasm::IString::interned(2,"||",0);
    target_03.str._M_str = auVar55._8_8_;
    target_03.str._M_len = (size_t)__M_create;
    RVar25 = cashew::ValueBuilder::makeCall((ValueBuilder *)ABI::wasm2js::TRAP,target_03);
    this = local_38;
    goto LAB_00141a06;
  default:
    ::wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
               ,0x46);
  }
LAB_001423f0:
  *(Value **)((long)this + 8) = args_3.inst;
  *(size_t *)((long)this + 0x10) = old.str._M_len;
  return (Ref)RVar24.inst;
}

Assistant:

Ref visit(Expression* curr, IString nextResult) {
      IString old = result;
      result = nextResult;
      Ref ret = OverriddenVisitor::visit(curr);
      // keep it consistent for the rest of this frame, which may call visit on
      // multiple children
      result = old;
      return ret;
    }